

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
ManySubcommands_Required1Exact_Test::TestBody(ManySubcommands_Required1Exact_Test *this)

{
  char *pcVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_93;
  allocator local_92;
  allocator local_91;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  (this->super_ManySubcommands).super_TApp.app.require_subcommand_min_ = 1;
  (this->super_ManySubcommands).super_TApp.app.require_subcommand_max_ = 1;
  TApp::run((TApp *)this);
  CLI::App::remaining_abi_cxx11_(&local_90,(this->super_ManySubcommands).sub1,false);
  std::__cxx11::string::string((string *)&local_50,"sub2",&local_91);
  std::__cxx11::string::string(local_30,"sub3",&local_92);
  __l._M_len = 2;
  __l._M_array = &local_50;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l,&local_93);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"sub1->remaining()","vs_t({\"sub2\", \"sub3\"})",&local_90,
             &local_68);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x29f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  CLI::App::remaining_abi_cxx11_(&local_90,&(this->super_ManySubcommands).super_TApp.app,true);
  std::__cxx11::string::string((string *)&local_50,"sub2",&local_91);
  std::__cxx11::string::string(local_30,"sub3",&local_92);
  __l_00._M_len = 2;
  __l_00._M_array = &local_50;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,__l_00,&local_93);
  testing::internal::
  CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((internal *)&gtest_ar,"app.remaining(true)","vs_t({\"sub2\", \"sub3\"})",&local_90,
             &local_68);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x2a0,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required1Exact) {
    app.require_subcommand(1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));
    EXPECT_EQ(app.remaining(true), vs_t({"sub2", "sub3"}));
}